

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

Fact * __thiscall
r_exec::HLPBindingMap::build_f_ihlp(HLPBindingMap *this,Code *hlp,uint16_t opcode,bool wr_enabled)

{
  int iVar1;
  _Object *p_Var2;
  pointer pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  Code *object;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Fact *this_00;
  Atom *s;
  uint16_t i;
  ulong uVar8;
  uint uVar9;
  Atom local_3c [6];
  uint16_t extent_index;
  Atom local_34 [4];
  
  plVar7 = (long *)r_code::Mem::Get();
  r_code::Atom::Object((ushort)local_34,(uchar)opcode);
  object = (Code *)(**(code **)(*plVar7 + 0x50))(plVar7,local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::RPointer((ushort)local_3c);
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar4),local_3c);
  r_code::Atom::~Atom(local_3c);
  (*(object->super__Object)._vptr__Object[0x19])(object,hlp);
  r_code::Atom::IPointer((ushort)local_3c);
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar4),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::Set((uchar)local_3c);
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,6);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar4),local_3c);
  r_code::Atom::~Atom(local_3c);
  uVar5._0_2_ = (this->super_BindingMap).first_index;
  uVar5._2_2_ = (this->super_BindingMap).fwd_after_index;
  extent_index = (undefined2)uVar5 + 7;
  for (uVar8 = 0; uVar8 < (uVar5 & 0xffff); uVar8 = uVar8 + 1) {
    p_Var2 = (this->super_BindingMap).map.
             super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar8].object;
    (*p_Var2->_vptr__Object[3])(p_Var2,object,uVar8 + 7 & 0xffff,&extent_index);
    uVar5 = (uint)(this->super_BindingMap).first_index;
  }
  r_code::Atom::IPointer((ushort)local_3c);
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar4),local_3c);
  r_code::Atom::~Atom(local_3c);
  iVar4 = *(int *)&(this->super_BindingMap).map.
                   super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  uVar9._0_2_ = (this->super_BindingMap).first_index;
  uVar9._2_2_ = (this->super_BindingMap).fwd_after_index;
  iVar1 = *(int *)&(this->super_BindingMap).map.
                   super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  r_code::Atom::Set((uchar)local_3c);
  iVar6 = (*(object->super__Object)._vptr__Object[4])(object,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar6),local_3c);
  r_code::Atom::~Atom(local_3c);
  uVar5 = (uint)extent_index;
  extent_index = (extent_index + ((short)((uint)(iVar4 - iVar1) >> 3) - (undefined2)uVar9)) - 1;
  uVar5 = uVar5 + 1;
  while( true ) {
    uVar9 = uVar9 & 0xffff;
    pPVar3 = (this->super_BindingMap).map.
             super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_BindingMap).map.
                      super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) <=
        (ulong)uVar9) break;
    if ((uVar9 != (int)(this->super_BindingMap).fwd_after_index) &&
       (uVar9 != (int)(this->super_BindingMap).fwd_before_index)) {
      p_Var2 = pPVar3[uVar9].object;
      (*p_Var2->_vptr__Object[3])(p_Var2,object,(ulong)(uVar5 & 0xffff),&extent_index);
      uVar5 = (uVar5 & 0xffff) + 1;
    }
    uVar9 = uVar9 + 1;
  }
  r_code::Atom::Boolean(SUB81(local_3c,0));
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar4),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::Float(1.0);
  iVar4 = (*(object->super__Object)._vptr__Object[4])(object,5);
  s = local_3c;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar4),s);
  r_code::Atom::~Atom(local_3c);
  this_00 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact(this_00,object,0,0,1.0,1.0);
  extent_index = 6;
  p_Var2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(this->super_BindingMap).fwd_after_index].object
  ;
  (*p_Var2->_vptr__Object[3])(p_Var2,this_00,2,&extent_index);
  p_Var2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(this->super_BindingMap).fwd_before_index].
           object;
  (*p_Var2->_vptr__Object[3])(p_Var2,this_00,3,&extent_index);
  return this_00;
}

Assistant:

Fact *HLPBindingMap::build_f_ihlp(Code *hlp, uint16_t opcode, bool wr_enabled) const
{
    Code *ihlp = _Mem::Get()->build_object(Atom::Object(opcode, I_HLP_ARITY));
    ihlp->code(I_HLP_OBJ) = Atom::RPointer(0);
    ihlp->add_reference(hlp);
    uint16_t tpl_arg_index = I_HLP_ARITY + 1;
    ihlp->code(I_HLP_TPL_ARGS) = Atom::IPointer(tpl_arg_index);
    ihlp->code(tpl_arg_index) = Atom::Set(first_index);
    uint16_t write_index = tpl_arg_index + 1;
    uint16_t extent_index = write_index + first_index;

    for (uint16_t i = 0; i < first_index; ++i) { // valuate tpl args.
        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_ARGS) = Atom::IPointer(extent_index);
    uint16_t exposed_arg_start = first_index;
    uint16_t exposed_arg_count = map.size() - exposed_arg_start - 2; // -2: do not expose the first after/before timestamps.
    ihlp->code(extent_index) = Atom::Set(exposed_arg_count);
    write_index = extent_index + 1;
    extent_index = write_index + exposed_arg_count;

    for (uint16_t i = exposed_arg_start; i < map.size(); ++i) { // valuate args.
        if (i == fwd_after_index) {
            continue;
        }

        if (i == fwd_before_index) {
            continue;
        }

        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_WR_E) = Atom::Boolean(wr_enabled);
    ihlp->code(I_HLP_ARITY) = Atom::Float(1); // psln_thr.
    Fact *f_ihlp = new Fact(ihlp, 0, 0, 1, 1);
    extent_index = FACT_ARITY + 1;
    map[fwd_after_index]->valuate(f_ihlp, FACT_AFTER, extent_index);
    map[fwd_before_index]->valuate(f_ihlp, FACT_BEFORE, extent_index);
    return f_ihlp;
}